

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_band.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  SUNMatrix A;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  N_Vector p_Var14;
  N_Vector p_Var15;
  undefined8 *puVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  char *__s;
  long lVar23;
  long lVar24;
  long lVar25;
  SUNMatrix p_Var26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  SUNContext sunctx;
  undefined8 local_90;
  SUNMatrix local_88;
  long local_80;
  long local_78;
  SUNMatrix local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  N_Vector local_48;
  N_Vector local_40;
  long local_38;
  
  iVar4 = SUNContext_Create(0,&local_90);
  if (iVar4 == 0) {
    if (argc < 5) {
      __s = 
      "ERROR: FOUR (4) Inputs required: matrix cols, matrux uband, matrix lband, print timing ";
    }
    else {
      lVar12 = atol(argv[1]);
      if (lVar12 < 1) {
        __s = "ERROR: number of matrix columns must be a positive integer ";
      }
      else {
        lVar13 = atol(argv[2]);
        if (lVar13 < 1 || lVar12 <= lVar13) {
          __s = 
          "ERROR: matrix upper bandwidth must be a positive integer, less than number of columns ";
        }
        else {
          local_80 = atol(argv[3]);
          if (0 < local_80 && local_80 < lVar12) {
            iVar4 = atoi(argv[4]);
            SetTiming(iVar4);
            lVar25 = 0;
            printf("\nBand matrix test: size %ld, bandwidths %ld %ld\n\n",lVar12,lVar13,local_80);
            local_70 = (SUNMatrix)SUNBandMatrix(lVar12,lVar13,local_80,local_90);
            local_88 = (SUNMatrix)SUNBandMatrix(lVar12,0,0,local_90);
            p_Var14 = (N_Vector)N_VNew_Serial(lVar12,local_90);
            p_Var15 = (N_Vector)N_VNew_Serial(lVar12,local_90);
            local_78 = lVar13;
            local_40 = p_Var14;
            local_50 = N_VGetArrayPointer(p_Var14);
            lVar20 = local_78;
            local_48 = p_Var15;
            local_58 = N_VGetArrayPointer(p_Var15);
            local_60 = lVar12 + -1;
            local_68 = local_60 - local_80;
            local_38 = local_80 + 1;
            lVar13 = local_80 + 2;
            do {
              lVar24 = lVar25;
              if (lVar20 < lVar25) {
                lVar24 = lVar20;
              }
              lVar20 = local_68;
              if (lVar25 < local_68) {
                lVar20 = lVar25;
              }
              lVar18 = local_60 - lVar25;
              if (lVar25 <= local_68) {
                lVar18 = local_80;
              }
              puVar16 = (undefined8 *)SUNBandMatrix_Column(local_88,lVar25);
              *puVar16 = 0x3ff0000000000000;
              lVar17 = SUNBandMatrix_Column(local_70);
              A = local_70;
              p_Var26 = local_88;
              auVar3 = _DAT_00103020;
              auVar2 = _DAT_00103010;
              if (SBORROW8(lVar18,-lVar24) == lVar18 + lVar24 < 0) {
                lVar18 = lVar24 + lVar25;
                lVar22 = lVar25;
                if (local_78 < lVar25) {
                  lVar22 = local_78;
                }
                lVar23 = local_68;
                if (lVar25 < local_68) {
                  lVar23 = lVar25;
                }
                lVar22 = (local_38 - lVar25) + lVar23 + lVar22 + -1;
                auVar28._8_4_ = (int)lVar22;
                auVar28._0_8_ = lVar22;
                auVar28._12_4_ = (int)((ulong)lVar22 >> 0x20);
                lVar17 = lVar17 + lVar24 * -8;
                auVar28 = auVar28 ^ _DAT_00103020;
                uVar19 = 0;
                do {
                  auVar29._8_4_ = (int)uVar19;
                  auVar29._0_8_ = uVar19;
                  auVar29._12_4_ = (int)(uVar19 >> 0x20);
                  auVar29 = (auVar29 | auVar2) ^ auVar3;
                  bVar1 = auVar28._0_4_ < auVar29._0_4_;
                  iVar4 = auVar28._4_4_;
                  iVar5 = auVar29._4_4_;
                  if ((bool)(~(iVar4 < iVar5 || iVar5 == iVar4 && bVar1) & 1)) {
                    *(double *)(lVar17 + uVar19 * 8) = (double)lVar18;
                  }
                  if (iVar4 >= iVar5 && (iVar5 != iVar4 || !bVar1)) {
                    *(double *)(lVar17 + 8 + uVar19 * 8) = (double)(lVar18 + -1);
                  }
                  uVar19 = uVar19 + 2;
                  lVar18 = lVar18 + -2;
                } while ((lVar20 + lVar24 + lVar13 & 0xfffffffffffffffeU) != uVar19);
              }
              lVar25 = lVar25 + 1;
              lVar13 = lVar13 + -1;
              lVar20 = local_78;
            } while (lVar25 != lVar12);
            lVar13 = -local_80;
            lVar20 = 0;
            lVar25 = 0;
            do {
              lVar24 = 0;
              if (0 < lVar13) {
                lVar24 = lVar13;
              }
              *(double *)(local_50 + lVar25 * 8) = (double)lVar25;
              *(undefined8 *)(local_58 + lVar25 * 8) = 0;
              lVar18 = lVar25 - local_80;
              if (lVar25 - local_80 < 1) {
                lVar18 = 0;
              }
              lVar17 = lVar25 + local_78;
              if (lVar12 <= lVar25 + local_78) {
                lVar17 = local_60;
              }
              if (lVar18 <= lVar17) {
                lVar24 = lVar20 + lVar24 * 2;
                dVar27 = 0.0;
                do {
                  dVar27 = dVar27 + (double)(lVar24 * lVar18);
                  lVar24 = lVar24 + 2;
                  bVar1 = lVar18 < lVar17;
                  lVar18 = lVar18 + 1;
                } while (bVar1);
                *(double *)(local_58 + lVar25 * 8) = dVar27;
              }
              lVar25 = lVar25 + 1;
              lVar20 = lVar20 + -1;
              lVar13 = lVar13 + 1;
            } while (lVar25 != lVar12);
            iVar4 = Test_SUNMatGetID(local_70,SUNMATRIX_BAND,0);
            iVar5 = Test_SUNMatClone(A,0);
            iVar6 = Test_SUNMatCopy(A,0);
            iVar7 = Test_SUNMatZero(A,0);
            iVar8 = Test_SUNMatScaleAdd(A,p_Var26,0);
            iVar9 = Test_SUNMatScaleAddI(A,p_Var26,0);
            p_Var15 = local_40;
            p_Var14 = local_48;
            iVar10 = Test_SUNMatMatvec(A,local_40,local_48,0);
            iVar11 = Test_SUNMatSpace(A,0);
            uVar21 = iVar11 + iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4;
            if (uVar21 == 0) {
              puts("SUCCESS: SUNMatrix module passed all tests \n ");
              p_Var26 = local_88;
            }
            else {
              printf("FAIL: SUNMatrix module failed %i tests \n \n",(ulong)uVar21);
              puts("\nA =");
              SUNBandMatrix_Print(A,_stdout);
              puts("\nI =");
              p_Var26 = local_88;
              SUNBandMatrix_Print(local_88,_stdout);
              puts("\nx =");
              N_VPrint_Serial(p_Var15);
              puts("\ny =");
              N_VPrint_Serial(p_Var14);
            }
            SUNMatDestroy(A);
            SUNMatDestroy(p_Var26);
            N_VDestroy(p_Var15);
            N_VDestroy(p_Var14);
            SUNContext_Free(&local_90);
            return uVar21;
          }
          __s = 
          "ERROR: matrix lower bandwidth must be a positive integer, less than number of columns ";
        }
      }
    }
  }
  else {
    __s = "ERROR: SUNContext_Create failed";
  }
  puts(__s);
  return -1;
}

Assistant:

int main(int argc, char* argv[])
{
  int fails = 0;                   /* counter for test failures  */
  sunindextype cols, uband, lband; /* matrix columns, bandwidths */
  SUNMatrix A, I;                  /* test matrices              */
  N_Vector x, y;                   /* test vectors               */
  int print_timing;
  sunindextype i, j, k, kstart, kend, jstart, jend;
  sunrealtype *colj, *xdata, *ydata;
  SUNContext sunctx;

  if (SUNContext_Create(SUN_COMM_NULL, &sunctx))
  {
    printf("ERROR: SUNContext_Create failed\n");
    return (-1);
  }

  /* check input and set vector length */
  if (argc < 5)
  {
    printf("ERROR: FOUR (4) Inputs required: matrix cols, matrux uband, matrix "
           "lband, print timing \n");
    return (-1);
  }

  cols = (sunindextype)atol(argv[1]);
  if (cols <= 0)
  {
    printf("ERROR: number of matrix columns must be a positive integer \n");
    return (-1);
  }

  uband = (sunindextype)atol(argv[2]);
  if ((uband <= 0) || (uband >= cols))
  {
    printf("ERROR: matrix upper bandwidth must be a positive integer, less "
           "than number of columns \n");
    return (-1);
  }

  lband = (sunindextype)atol(argv[3]);
  if ((lband <= 0) || (lband >= cols))
  {
    printf("ERROR: matrix lower bandwidth must be a positive integer, less "
           "than number of columns \n");
    return (-1);
  }

  print_timing = atoi(argv[4]);
  SetTiming(print_timing);

  printf("\nBand matrix test: size %ld, bandwidths %ld %ld\n\n", (long int)cols,
         (long int)uband, (long int)lband);

  /* Initialize vectors and matrices to NULL */
  x = NULL;
  y = NULL;
  A = NULL;
  I = NULL;

  /* Create matrices and vectors */
  A = SUNBandMatrix(cols, uband, lband, sunctx);
  I = SUNBandMatrix(cols, 0, 0, sunctx);
  x = N_VNew_Serial(cols, sunctx);
  y = N_VNew_Serial(cols, sunctx);

  /* Fill matrices */
  xdata = N_VGetArrayPointer(x);
  ydata = N_VGetArrayPointer(y);
  for (j = 0; j < cols; j++)
  {
    /* identity matrix */
    colj    = SUNBandMatrix_Column(I, j);
    colj[0] = SUN_RCONST(1.0);

    /* A matrix */
    colj   = SUNBandMatrix_Column(A, j);
    kstart = (j < uband) ? -j : -uband;
    kend   = (j > cols - 1 - lband) ? cols - 1 - j : lband;
    for (k = kstart; k <= kend; k++)
    {
      colj[k] = j - k; /* A(i,j) = j + (j-i) */
    }
  }

  /* Fill vectors */
  for (i = 0; i < cols; i++)
  {
    /* x vector */
    xdata[i] = i;

    /* y vector */
    ydata[i] = SUN_RCONST(0.0);
    jstart   = SUNMAX(0, i - lband);
    jend     = SUNMIN(cols - 1, i + uband);
    for (j = jstart; j <= jend; j++) { ydata[i] += (j + j - i) * (j); }
  }

  /* Run Tests */
  fails += Test_SUNMatGetID(A, SUNMATRIX_BAND, 0);
  fails += Test_SUNMatClone(A, 0);
  fails += Test_SUNMatCopy(A, 0);
  fails += Test_SUNMatZero(A, 0);
  fails += Test_SUNMatScaleAdd(A, I, 0);
  fails += Test_SUNMatScaleAddI(A, I, 0);
  fails += Test_SUNMatMatvec(A, x, y, 0);
  fails += Test_SUNMatSpace(A, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNMatrix module failed %i tests \n \n", fails);
    printf("\nA =\n");
    SUNBandMatrix_Print(A, stdout);
    printf("\nI =\n");
    SUNBandMatrix_Print(I, stdout);
    printf("\nx =\n");
    N_VPrint_Serial(x);
    printf("\ny =\n");
    N_VPrint_Serial(y);
  }
  else { printf("SUCCESS: SUNMatrix module passed all tests \n \n"); }

  /* Free matrices and vectors */
  SUNMatDestroy(A);
  SUNMatDestroy(I);
  N_VDestroy(x);
  N_VDestroy(y);
  SUNContext_Free(&sunctx);

  return (fails);
}